

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_meta___tostring(lua_State *L)

{
  CTState *cts_00;
  TValue *pTVar1;
  int iVar2;
  GCcdata *pGVar3;
  cTValue *tv_00;
  GCstr *pGVar4;
  cTValue *tv;
  CType *ct;
  CTState *cts;
  void *p;
  char *pcStack_208;
  CTypeID id;
  char *msg;
  GCcdata *cd;
  lua_State *L_local;
  CTState *cts_1;
  cTValue *local_108;
  CType *ct_1;
  cTValue *local_a0;
  cTValue *local_60;
  CTState *local_10;
  
  pGVar3 = ffi_checkcdata(L,1);
  pcStack_208 = "cdata<%s>: %p";
  p._4_4_ = (CTypeID)pGVar3->ctypeid;
  cts = (CTState *)(pGVar3 + 1);
  if (p._4_4_ == 0x16) {
    pcStack_208 = "ctype<%s>";
    p._4_4_ = (CTypeID)((GCRef *)&cts->tab)->gcptr64;
  }
  else {
    cts_00 = *(CTState **)((L->glref).ptr64 + 0x180);
    cts_00->L = L;
    for (local_108 = (cTValue *)(cts_00->tab + p._4_4_); (local_108->u32).lo >> 0x1c == 8;
        local_108 = (cTValue *)(cts_00->tab + ((local_108->u32).lo & 0xffff))) {
    }
    tv = local_108;
    if (((local_108->u32).lo & 0xf0800000) == 0x20800000) {
      cts = (CTState *)((GCRef *)&cts->tab)->gcptr64;
      local_60 = local_108;
      do {
        tv = (cTValue *)(cts_00->tab + ((local_60->u32).lo & 0xffff));
        local_60 = tv;
      } while ((tv->u32).lo >> 0x1c == 8);
    }
    if (((tv->u32).lo & 0xf4000000) == 0x34000000) {
      pTVar1 = L->top;
      pGVar4 = lj_ctype_repr_complex(L,pGVar3 + 1,(tv->field_4).it);
      pTVar1[-1].u64 = (ulong)pGVar4 | 0xfffd800000000000;
      goto LAB_00138d58;
    }
    if (((tv->field_4).it == 8) && (((tv->u32).lo & 0xfc000000) == 0)) {
      pTVar1 = L->top;
      pGVar4 = lj_ctype_repr_int64(L,pGVar3[1].nextgc.gcptr64,(tv->u32).lo & 0x800000);
      pTVar1[-1].u64 = (ulong)pGVar4 | 0xfffd800000000000;
      goto LAB_00138d58;
    }
    if ((tv->u32).lo >> 0x1c == 6) {
      cts = (CTState *)cts->tab;
    }
    else if ((tv->u32).lo >> 0x1c == 5) {
      pcStack_208 = "cdata<%s>: %d";
      cts = (CTState *)cts->tab;
    }
    else {
      if ((tv->u32).lo >> 0x1c == 2) {
        if ((tv->field_4).it == 4) {
          local_10 = (CTState *)(ulong)*(uint *)&cts->tab;
        }
        else {
          local_10 = (CTState *)cts->tab;
        }
        cts = local_10;
        local_a0 = tv;
        do {
          tv = (cTValue *)(cts_00->tab + ((local_a0->u32).lo & 0xffff));
          local_a0 = tv;
        } while ((tv->u32).lo >> 0x1c == 8);
      }
      if ((((tv->u32).lo >> 0x1c == 1) || (((tv->u32).lo & 0xf8000000) == 0x38000000)) &&
         (tv_00 = lj_ctype_meta(cts_00,(CTypeID)(((long)tv - (long)cts_00->tab) / 0x18),MM_tostring)
         , tv_00 != (cTValue *)0x0)) {
        iVar2 = lj_meta_tailcall(L,tv_00);
        return iVar2;
      }
    }
  }
  pGVar4 = lj_ctype_repr(L,p._4_4_,(GCstr *)0x0);
  lj_strfmt_pushf(L,pcStack_208,pGVar4 + 1,cts);
LAB_00138d58:
  if (*(ulong *)((L->glref).ptr64 + 0x18) <= *(ulong *)((L->glref).ptr64 + 0x10)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_meta___tostring)
{
  GCcdata *cd = ffi_checkcdata(L, 1);
  const char *msg = "cdata<%s>: %p";
  CTypeID id = cd->ctypeid;
  void *p = cdataptr(cd);
  if (id == CTID_CTYPEID) {
    msg = "ctype<%s>";
    id = *(CTypeID *)p;
  } else {
    CTState *cts = ctype_cts(L);
    CType *ct = ctype_raw(cts, id);
    if (ctype_isref(ct->info)) {
      p = *(void **)p;
      ct = ctype_rawchild(cts, ct);
    }
    if (ctype_iscomplex(ct->info)) {
      setstrV(L, L->top-1, lj_ctype_repr_complex(L, cdataptr(cd), ct->size));
      goto checkgc;
    } else if (ct->size == 8 && ctype_isinteger(ct->info)) {
      setstrV(L, L->top-1, lj_ctype_repr_int64(L, *(uint64_t *)cdataptr(cd),
					       (ct->info & CTF_UNSIGNED)));
      goto checkgc;
    } else if (ctype_isfunc(ct->info)) {
      p = *(void **)p;
    } else if (ctype_isenum(ct->info)) {
      msg = "cdata<%s>: %d";
      p = (void *)(uintptr_t)*(uint32_t **)p;
    } else {
      if (ctype_isptr(ct->info)) {
	p = cdata_getptr(p, ct->size);
	ct = ctype_rawchild(cts, ct);
      }
      if (ctype_isstruct(ct->info) || ctype_isvector(ct->info)) {
	/* Handle ctype __tostring metamethod. */
	cTValue *tv = lj_ctype_meta(cts, ctype_typeid(cts, ct), MM_tostring);
	if (tv)
	  return lj_meta_tailcall(L, tv);
      }
    }
  }
  lj_strfmt_pushf(L, msg, strdata(lj_ctype_repr(L, id, NULL)), p);
checkgc:
  lj_gc_check(L);
  return 1;
}